

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_3,_3> *
tcu::operator*(Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *mtx,float scalar)

{
  Vector<float,_3> *pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix<float,_3,_3> *pMVar4;
  int col;
  long lVar5;
  int row_1;
  float *pfVar6;
  Matrix<float,_3,_3> *res;
  int row;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  long lVar10;
  
  pMVar4 = __return_storage_ptr__;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar3 = _DAT_00ac4b80;
  auVar2 = _DAT_00ac4b30;
  lVar5 = 0;
  lVar7 = 0;
  pfVar6 = (float *)__return_storage_ptr__;
  do {
    lVar8 = 0;
    auVar9 = auVar2;
    do {
      bVar11 = SUB164(auVar9 ^ auVar3,4) == -0x80000000 && SUB164(auVar9 ^ auVar3,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar6 + lVar8) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar5 + -0xc != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar6 + lVar8 + 0xc) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0xc;
    pfVar6 = pfVar6 + 1;
  } while (lVar7 != 3);
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar7] =
           ((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)mtx)->m_data)->m_data[0].m_data
           [lVar7] * scalar;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    __return_storage_ptr__ = (Matrix<float,_3,_3> *)((long)__return_storage_ptr__ + 0xc);
    mtx = (Matrix<float,_3,_3> *)((long)mtx + 0xc);
  } while (lVar5 != 3);
  return pMVar4;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}